

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void do_release(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char local_1218 [4616];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Release which follower?\n\r";
  }
  else {
    ch_00 = get_char_room(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else {
      bVar1 = is_affected_by(ch_00,0x12);
      if ((bVar1) && (ch_00->master == ch)) {
        bVar1 = is_npc(ch_00);
        if (bVar1) {
          act("$n slowly fades away.",ch_00,(void *)0x0,(void *)0x0,0);
          extract_char(ch_00,true);
          return;
        }
        txt = "You can\'t release a player into the void..maybe nofollow them?\n\r";
      }
      else {
        txt = "They aren\'t under your control.\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_release(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Release which follower?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!is_affected_by(victim, AFF_CHARM) || victim->master != ch)
	{
		send_to_char("They aren't under your control.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		act("$n slowly fades away.", victim, 0, 0, TO_ROOM);
		extract_char(victim, true);
	}
	else
	{
		send_to_char("You can't release a player into the void..maybe nofollow them?\n\r", ch);
		return;
	}
}